

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall Heap<int>::HeapifyUp(Heap<int> *this,int index)

{
  int iVar1;
  reference pvVar2;
  int local_14;
  int index_local;
  Heap<int> *this_local;
  
  local_14 = index;
  while( true ) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->_data,(long)local_14);
    iVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->_data,(long)((local_14 + -1) / 2));
    if (iVar1 <= *pvVar2) break;
    Swap(this,local_14,(local_14 + -1) / 2);
    local_14 = (local_14 + -1) / 2;
  }
  return;
}

Assistant:

void Heap<T>::HeapifyUp(int index) {
    while (_data[index] > _data[(index - 1) / 2]) {
        Swap(index, (index - 1) / 2);
        index = (index - 1) / 2;
    }

}